

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepScanLineInputFile::setFrameBuffer
          (DeepScanLineInputFile *this,DeepFrameBuffer *frameBuffer)

{
  _Base_ptr p_Var1;
  _Rb_tree_color _Var2;
  pthread_mutex_t *__mutex;
  Data *pDVar3;
  undefined8 uVar4;
  _Base_ptr p_Var5;
  pointer puVar6;
  pointer puVar7;
  pointer ppIVar8;
  _Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  *this_00;
  undefined4 uVar9;
  pointer ppIVar10;
  int iVar11;
  ChannelList *this_01;
  const_iterator cVar12;
  ConstIterator CVar13;
  ConstIterator CVar14;
  const_iterator cVar15;
  Slice *pSVar16;
  pointer ppIVar17;
  ostream *poVar18;
  char *pcVar19;
  ArgExc *pAVar20;
  long lVar21;
  size_t i;
  const_iterator cVar22;
  long lVar23;
  size_t __n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar24;
  bool bVar25;
  size_t i_1;
  ulong uVar26;
  pointer ppIVar27;
  ulong __n_00;
  value_type local_1c0;
  vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  slices;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  this_01 = Header::channels(&this->_data->header);
  for (cVar12._M_node = (_Base_ptr)DeepFrameBuffer::begin(frameBuffer);
      CVar13 = DeepFrameBuffer::end(frameBuffer),
      (const_iterator)cVar12._M_node != CVar13._i._M_node;
      cVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar12._M_node)) {
    CVar14 = ChannelList::find(this_01,(char *)(cVar12._M_node + 1));
    cVar15._M_node = (_Base_ptr)ChannelList::end(this_01);
    if ((CVar14._i._M_node != (const_iterator)cVar15._M_node) &&
       ((*(_Rb_tree_color *)((long)CVar14._i._M_node + 0x124) != cVar12._M_node[10]._M_color ||
        (*(int *)((long)CVar14._i._M_node + 0x128) != *(int *)&cVar12._M_node[10].field_0x4)))) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&slices);
      poVar18 = std::operator<<((ostream *)
                                &slices.
                                 super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                "X and/or y subsampling factors of \"");
      poVar18 = std::operator<<(poVar18,(char *)((long)CVar14._i._M_node + 0x20));
      poVar18 = std::operator<<(poVar18,"\" channel of input file \"");
      pcVar19 = fileName(this);
      poVar18 = std::operator<<(poVar18,pcVar19);
      std::operator<<(poVar18,"\" are not compatible with the frame buffer\'s subsampling factors.")
      ;
      pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar20,(stringstream *)&slices);
      __cxa_throw(pAVar20,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
  }
  pSVar16 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  if (pSVar16->base == (char *)0x0) {
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar20,"Invalid base pointer, please set a proper sample count slice.")
    ;
    __cxa_throw(pAVar20,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pDVar3 = this->_data;
  pDVar3->sampleCountSliceBase = pSVar16->base;
  sVar24 = pSVar16->yStride;
  pDVar3->sampleCountXStride = (int)pSVar16->xStride;
  pDVar3->sampleCountYStride = (int)sVar24;
  slices.
  super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  slices.
  super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  slices.
  super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar15._M_node = (_Base_ptr)ChannelList::begin(this_01);
  cVar12._M_node = (_Base_ptr)DeepFrameBuffer::begin(frameBuffer);
  for (; CVar13 = DeepFrameBuffer::end(frameBuffer),
      (const_iterator)cVar12._M_node != CVar13._i._M_node;
      cVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar12._M_node)) {
    while ((CVar14 = ChannelList::end(this_01), (const_iterator)cVar15._M_node != CVar14._i._M_node
           && (iVar11 = strcmp((char *)(cVar15._M_node + 1),(char *)(cVar12._M_node + 1)),
              iVar11 < 0))) {
      local_1c0 = (value_type)operator_new(0x48);
      _Var2 = cVar15._M_node[9]._M_color;
      local_1c0->typeInFrameBuffer = _Var2;
      local_1c0->typeInFile = _Var2;
      local_1c0->base = (char *)0x0;
      uVar4 = *(undefined8 *)&cVar15._M_node[9].field_0x4;
      local_1c0->sampleStride = 0;
      local_1c0->xPointerStride = 0;
      local_1c0->yPointerStride = 0;
      local_1c0->xSampling = (int)uVar4;
      local_1c0->ySampling = (int)((ulong)uVar4 >> 0x20);
      local_1c0->fill = false;
      local_1c0->skip = true;
      local_1c0->fillValue = 0.0;
      std::
      vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
      ::push_back(&slices,&local_1c0);
      cVar15._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar15._M_node);
    }
    CVar14 = ChannelList::end(this_01);
    if (((const_iterator)cVar15._M_node == CVar14._i._M_node) ||
       (iVar11 = strcmp((char *)(cVar15._M_node + 1),(char *)(cVar12._M_node + 1)), 0 < iVar11)) {
      bVar25 = true;
    }
    else {
      bVar25 = false;
    }
    local_1c0 = (value_type)operator_new(0x48);
    cVar22._M_node = cVar15._M_node;
    if (bVar25 != false) {
      cVar22._M_node = cVar12._M_node;
    }
    p_Var5 = cVar12._M_node[9]._M_parent;
    _Var2 = cVar22._M_node[9]._M_color;
    iVar11 = *(int *)((long)&cVar12._M_node[10]._M_left + 4);
    p_Var1 = cVar12._M_node[10]._M_parent;
    local_1c0->typeInFrameBuffer = cVar12._M_node[9]._M_color;
    local_1c0->typeInFile = _Var2;
    local_1c0->base = (char *)p_Var5;
    p_Var5 = cVar12._M_node[9]._M_right;
    local_1c0->xPointerStride = (size_t)cVar12._M_node[9]._M_left;
    local_1c0->yPointerStride = (size_t)p_Var5;
    local_1c0->sampleStride = (long)iVar11;
    uVar9 = *(undefined4 *)&cVar12._M_node[10].field_0x4;
    local_1c0->xSampling = cVar12._M_node[10]._M_color;
    local_1c0->ySampling = uVar9;
    local_1c0->fill = bVar25;
    local_1c0->skip = false;
    local_1c0->fillValue = (double)p_Var1;
    std::
    vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
    ::push_back(&slices,&local_1c0);
    CVar14 = ChannelList::end(this_01);
    if (bVar25 == false && (const_iterator)cVar15._M_node != CVar14._i._M_node) {
      cVar15._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar15._M_node);
    }
  }
  pDVar3 = this->_data;
  lVar23 = (pDVar3->gotSampleCount)._size;
  lVar21 = 0;
  if (lVar23 < 1) {
    lVar23 = lVar21;
  }
  for (; lVar23 != lVar21; lVar21 = lVar21 + 1) {
    (pDVar3->gotSampleCount)._data[lVar21] = false;
  }
  puVar6 = (pDVar3->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar7 = (pDVar3->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (lVar23 = 0; (long)puVar7 - (long)puVar6 >> 3 != lVar23; lVar23 = lVar23 + 1) {
    puVar6[lVar23] = 0;
  }
  DeepFrameBuffer::operator=(&pDVar3->frameBuffer,frameBuffer);
  uVar26 = 0;
  while( true ) {
    pDVar3 = this->_data;
    ppIVar17 = (pDVar3->slices).
               super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppIVar8 = (pDVar3->slices).
              super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __n = (long)ppIVar8 - (long)ppIVar17;
    if ((ulong)((long)__n >> 3) <= uVar26) break;
    frameBuffer = (DeepFrameBuffer *)0x48;
    operator_delete(ppIVar17[uVar26],0x48);
    uVar26 = uVar26 + 1;
  }
  ppIVar27 = slices.
             super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppIVar10 = slices.
             super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  uVar26 = (long)slices.
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)slices.
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pDVar3->slices).
                    super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar17) < uVar26) {
    ppIVar17 = std::
               _Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
               ::_M_allocate((_Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                              *)((long)uVar26 >> 3),(size_t)frameBuffer);
    sVar24 = extraout_RDX;
    if (ppIVar10 != ppIVar27) {
      memcpy(ppIVar17,ppIVar27,uVar26);
      sVar24 = extraout_RDX_00;
    }
    this_00 = (_Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
               *)(pDVar3->slices).
                 super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    std::
    _Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
    ::_M_deallocate(this_00,(pointer)((long)(pDVar3->slices).
                                            super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)this_00 >> 3),sVar24);
    (pDVar3->slices).
    super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppIVar17;
    (pDVar3->slices).
    super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppIVar17 + uVar26);
  }
  else {
    if (__n < uVar26) {
      if (ppIVar8 != ppIVar17) {
        memmove(ppIVar17,slices.
                         super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,__n);
        ppIVar8 = (pDVar3->slices).
                  super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)ppIVar8 -
              (long)(pDVar3->slices).
                    super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      }
      ppIVar17 = ppIVar8;
      ppIVar27 = (pointer)((long)ppIVar27 + __n);
      __n_00 = (long)ppIVar10 - (long)ppIVar27;
      if (__n_00 == 0) goto LAB_001633f3;
    }
    else {
      __n_00 = uVar26;
      if (slices.
          super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          slices.
          super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_start) goto LAB_001633f3;
    }
    memmove(ppIVar17,ppIVar27,__n_00);
  }
LAB_001633f3:
  (pDVar3->slices).
  super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(uVar26 + (long)(pDVar3->slices).
                                super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  this->_data->frameBufferValid = true;
  std::
  vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  ::~vector(&slices);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepScanLineInputFile::setFrameBuffer (const DeepFrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif

    //
    // Check if the new frame buffer descriptor is
    // compatible with the image file header.
    //

    const ChannelList& channels = _data->header.channels ();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin ();
         j != frameBuffer.end ();
         ++j)
    {
        ChannelList::ConstIterator i = channels.find (j.name ());

        if (i == channels.end ()) continue;

        if (i.channel ().xSampling != j.slice ().xSampling ||
            i.channel ().ySampling != j.slice ().ySampling)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << i.name ()
                    << "\" channel "
                       "of input file \""
                    << fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
    }

    //
    // Store the pixel sample count table.
    // (TODO) Support for different sampling rates?
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice ();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = static_cast<int> (sampleCountSlice.xStride);
        _data->sampleCountYStride = static_cast<int> (sampleCountSlice.yStride);
    }

    //
    // Initialize the slice table for readPixels().
    //

    vector<InSliceInfo*>       slices;
    ChannelList::ConstIterator i = channels.begin ();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin ();
         j != frameBuffer.end ();
         ++j)
    {
        while (i != channels.end () && strcmp (i.name (), j.name ()) < 0)
        {
            //
            // Channel i is present in the file but not
            // in the frame buffer; data for channel i
            // will be skipped during readPixels().
            //

            slices.push_back (new InSliceInfo (
                i.channel ().type,
                NULL,
                i.channel ().type,
                0,
                0,
                0, // sampleStride
                i.channel ().xSampling,
                i.channel ().ySampling,
                false, // fill
                true,  // skip
                0.0)); // fillValue
            ++i;
        }

        bool fill = false;

        if (i == channels.end () || strcmp (i.name (), j.name ()) > 0)
        {
            //
            // Channel i is present in the frame buffer, but not in the file.
            // In the frame buffer, slice j will be filled with a default value.
            //

            fill = true;
        }

        slices.push_back (new InSliceInfo (
            j.slice ().type,
            j.slice ().base,
            fill ? j.slice ().type : i.channel ().type,
            j.slice ().xStride,
            j.slice ().yStride,
            j.slice ().sampleStride,
            j.slice ().xSampling,
            j.slice ().ySampling,
            fill,
            false, // skip
            j.slice ().fillValue));

        if (i != channels.end () && !fill) ++i;
    }

    //
    // Client may want data to be filled in multiple arrays,
    // so we reset gotSampleCount and bytesPerLine.
    //

    for (long i = 0; i < _data->gotSampleCount.size (); i++)
        _data->gotSampleCount[i] = false;
    for (size_t i = 0; i < _data->bytesPerLine.size (); i++)
        _data->bytesPerLine[i] = 0;

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size (); i++)
        delete _data->slices[i];
    _data->slices           = slices;
    _data->frameBufferValid = true;
}